

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

int __thiscall ON_Xform::IsSimilarity(ON_Xform *this,double tol)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  ON_Interval OVar4;
  double det;
  double dist;
  double lambda;
  ON_Interval Spectrum;
  ON_Xform L;
  int rval;
  double tol_local;
  ON_Xform *this_local;
  
  L.m_xform[3][3]._4_4_ = 0;
  bVar1 = IsAffine(this);
  if (bVar1) {
    memcpy(Spectrum.m_t + 1,this,0x80);
    Linearize((ON_Xform *)(Spectrum.m_t + 1));
    OVar4 = ApproxSpectrumLTL((ON_Xform *)(Spectrum.m_t + 1));
    lambda = OVar4.m_t[0];
    Spectrum.m_t[0] = OVar4.m_t[1];
    dVar2 = ON_Interval::Mid((ON_Interval *)&lambda);
    dVar3 = ON_Interval::Length((ON_Interval *)&lambda);
    if ((dVar3 / 2.0 < tol) && (dVar3 / 2.0 < ABS(dVar2))) {
      dVar2 = Determinant((ON_Xform *)(Spectrum.m_t + 1),(double *)0x0);
      L.m_xform[3][3]._4_4_ = -1;
      if (0.0 < dVar2) {
        L.m_xform[3][3]._4_4_ = 1;
      }
    }
  }
  return L.m_xform[3][3]._4_4_;
}

Assistant:

int ON_Xform::IsSimilarity(double tol) const
{
	// This function does not construct a similarity transformation,
	// ( see ON_Xform::DecomposeSimilarity() for this ).  It merely
	// indicates that this transformation is sufficiently close to a similarity.
	// However using with a tight tolerance like tol<ON_ZERO_TOLERANCE 
	// Indicates that this is very close to being a similar transformation.
	// This calculations is based on approximations and is only  
	// reliable if tolerance << 1.0. 
	int rval = 0;
	if (IsAffine())
	{
		// L = Linear component of this. 
		// LTL = L^T * L
		//  *this is similar iff Spectrum(LTL) = lambda, for real lambda!=0.0
		ON_Xform L = (*this);
		L.Linearize();


		ON_Interval Spectrum = ApproxSpectrumLTL(L);
		double lambda = Spectrum.Mid();
		double dist = Spectrum.Length() / 2.0;
		if (dist < tol && fabs(lambda)>dist )
		{
			double det = L.Determinant();
			rval = (det > 0) ? 1 : -1;
		}
	}
	return rval;
}